

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudioVoice_GetOutputMatrix
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,uint32_t SourceChannels,
               uint32_t DestinationChannels,float *pLevelMatrix)

{
  code *pcVar1;
  int iVar2;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32_t i;
  uint local_24;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x1286ac);
  local_24 = 0;
  while ((local_24 < *(uint *)(in_RDI + 0x10) &&
         (in_RSI != *(long *)(*(long *)(in_RDI + 0x14) + (ulong)local_24 * 0xc + 4)))) {
    local_24 = local_24 + 1;
  }
  if (local_24 < *(uint *)(in_RDI + 0x10)) {
    if (*(int *)(in_RDI + 0xc) == 0) {
      do {
        if (in_EDX == *(ushort *)(*(long *)(in_RDI + 0xf8) + 2)) goto LAB_001287dc;
        iVar2 = SDL_ReportAssertion(&FAudioVoice_GetOutputMatrix::sdl_assert_data,
                                    "FAudioVoice_GetOutputMatrix",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                    ,0x872);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    else {
      do {
        if (in_EDX == *(uint *)(in_RDI + 0xe8)) goto LAB_001287dc;
        iVar2 = SDL_ReportAssertion(&FAudioVoice_GetOutputMatrix::sdl_assert_data_1,
                                    "FAudioVoice_GetOutputMatrix",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                    ,0x876);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
LAB_001287dc:
    if (*(int *)(in_RSI + 0xc) == 2) {
      do {
        if (in_ECX == *(uint *)(in_RSI + 0xd8)) goto LAB_0012889b;
        iVar2 = SDL_ReportAssertion(&FAudioVoice_GetOutputMatrix::sdl_assert_data_2,
                                    "FAudioVoice_GetOutputMatrix",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                    ,0x87a);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    else {
      do {
        if (in_ECX == *(uint *)(in_RSI + 0xe8)) goto LAB_0012889b;
        iVar2 = SDL_ReportAssertion(&FAudioVoice_GetOutputMatrix::sdl_assert_data_3,
                                    "FAudioVoice_GetOutputMatrix",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                    ,0x87e);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
LAB_0012889b:
    SDL_memcpy(in_R8,*(undefined8 *)(*(long *)(in_RDI + 0x20) + (ulong)local_24 * 8),
               (ulong)in_EDX * 4 * (ulong)in_ECX);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1288d9);
  }
  else {
    FAudio_PlatformUnlockMutex((FAudioMutex)0x128711);
  }
  return;
}

Assistant:

void FAudioVoice_GetOutputMatrix(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	uint32_t SourceChannels,
	uint32_t DestinationChannels,
	float *pLevelMatrix
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)
	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Verify the Source/Destination channel count */
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		FAudio_assert(SourceChannels == voice->src.format->nChannels);
	}
	else
	{
		FAudio_assert(SourceChannels == voice->mix.inputChannels);
	}
	if (pDestinationVoice->type == FAUDIO_VOICE_MASTER)
	{
		FAudio_assert(DestinationChannels == pDestinationVoice->master.inputChannels);
	}
	else
	{
		FAudio_assert(DestinationChannels == pDestinationVoice->mix.inputChannels);
	}

	/* Get the matrix values, finally */
	FAudio_memcpy(
		pLevelMatrix,
		voice->sendCoefficients[i],
		sizeof(float) * SourceChannels * DestinationChannels
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}